

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O2

double duckdb::Cast::Operation<signed_char,double>(char input)

{
  bool bVar1;
  InvalidInputException *this;
  undefined7 in_register_00000039;
  double result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = duckdb::TryCast::Operation<signed_char,double>
                    (CONCAT71(in_register_00000039,input),&result,0);
  if (bVar1) {
    return result;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  duckdb::TypeIdToString_abi_cxx11_((PhysicalType)&local_d8);
  std::operator+(&local_b8,"Type ",&local_d8);
  std::operator+(&local_98,&local_b8," with value ");
  duckdb::ConvertToString::Operation<signed_char>(&local_f8,(int)input);
  std::operator+(&local_78,&local_98,&local_f8);
  std::operator+(&local_58,&local_78,
                 " can\'t be cast because the value is out of range for the destination type ");
  duckdb::TypeIdToString_abi_cxx11_((PhysicalType)&local_118);
  std::operator+(&local_38,&local_58,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  duckdb::InvalidInputException::InvalidInputException(this,(string *)&local_38);
  __cxa_throw(this,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}